

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

string * __thiscall
t_py_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_py_generator *this)

{
  bool gen_twisted;
  t_program *ptVar1;
  pointer pptVar2;
  pointer pptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar1 = (this->super_t_generator).program_;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_b0);
  pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pptVar3 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar3 != pptVar2; pptVar3 = pptVar3 + 1
      ) {
    ptVar1 = *pptVar3;
    gen_twisted = this->gen_twisted_;
    std::__cxx11::string::string((string *)&local_90,(string *)&this->package_prefix_);
    get_real_py_module(&local_70,ptVar1,gen_twisted,&local_90);
    std::operator+(&local_50,"import ",&local_70);
    std::operator+(&local_b0,&local_50,".ttypes\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_includes() {
  const vector<t_program*>& includes = program_->get_includes();
  string result = "";
  for (auto include : includes) {
    result += "import " + get_real_py_module(include, gen_twisted_, package_prefix_) + ".ttypes\n";
  }
  return result;
}